

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester_mq_test.c
# Opt level: O3

void sender(char *mq_name)

{
  uint uVar1;
  __pid_t pid;
  char *mq_name_00;
  int iVar2;
  tester_mq_msg tStackY_490;
  char acStackY_90 [39];
  _Bool _StackY_69;
  char *pcStackY_68;
  undefined *puStackY_60;
  _Bool local_29 [8];
  _Bool err;
  
  local_29[0] = false;
  fprintf(_stderr,"%s\n","SENDER: creating mq...");
  uVar1 = tester_mq_start(false,mq_name,local_29);
  if (local_29[0] != true) {
    mq_name = (char *)(ulong)uVar1;
    fprintf(_stderr,"%s\n","SENDER: created mq");
    fprintf(_stderr,"%s\n","SENDER: sending COMPLETED...");
    tester_mq_send(uVar1,"completed",true,0,false,false,local_29);
    if (local_29[0] != true) {
      fprintf(_stderr,"%s\n","SENDER: sent COMPLETED");
      sleep(3);
      fprintf(_stderr,"%s\n","SENDER: sending IGNORED...");
      tester_mq_send(uVar1,"ignored",false,0,true,false,local_29);
      if (local_29[0] != true) {
        fprintf(_stderr,"%s\n","SENDER: sent IGNORED");
        sleep(3);
        fprintf(_stderr,"%s\n","SENDER: sending ACCEPTED...");
        tester_mq_send(uVar1,"accepted",false,0,false,true,local_29);
        if (local_29[0] != true) {
          fprintf(_stderr,"%s\n","SENDER: sent ACCEPTED");
          sleep(3);
          fprintf(_stderr,"%s\n","SENDER: finishing...");
          tester_mq_finish(false,uVar1,(char *)0x0,local_29);
          if (local_29[0] != true) {
            fprintf(_stderr,"%s\n","SENDER: finish");
            return;
          }
        }
      }
    }
  }
  err_sender();
  puStackY_60 = &stderr;
  _StackY_69 = false;
  pcStackY_68 = mq_name;
  pid = getpid();
  tester_mq_get_name_from_pid(pid,acStackY_90);
  printf("Starting fork with queue name: %s\n",acStackY_90);
  async_sender(acStackY_90);
  fprintf(_stderr,"%s\n","RECEIVER: creating mq...");
  mq_name_00 = (char *)0x1;
  uVar1 = tester_mq_start(true,acStackY_90,&_StackY_69);
  if (_StackY_69 != true) {
    fprintf(_stderr,"%s\n","RECEIVER: created mq");
    iVar2 = -3;
    do {
      mq_name_00 = (char *)(ulong)uVar1;
      tester_mq_receive(uVar1,&tStackY_490,&_StackY_69);
      if (_StackY_69 == true) goto LAB_001014ec;
      fprintf(_stderr,"%s\n","RECEIVER: received message:");
      fprintf(_stderr,"%s\n",tStackY_490.word);
      fprintf(_stderr,"%s\n","");
      iVar2 = iVar2 + 1;
    } while (iVar2 != 0);
    fprintf(_stderr,"%s\n","RECEIVER: finishing...");
    mq_name_00 = (char *)0x1;
    tester_mq_finish(true,uVar1,acStackY_90,&_StackY_69);
    if (_StackY_69 != true) {
      fprintf(_stderr,"%s\n","RECEIVER: finish");
      wait((void *)0x0);
      __errno_location();
      return;
    }
  }
LAB_001014ec:
  err_receiver();
  sleep(10);
  sender(mq_name_00);
  exit(0);
}

Assistant:

void sender(const char * mq_name) {
    bool err = false;

    test_log("SENDER: creating mq...");
    mqd_t tester_mq = tester_mq_start(false, mq_name, &err);
    HANDLE_ERR(err_sender);
    test_log("SENDER: created mq");

    test_log("SENDER: sending COMPLETED...");
    tester_mq_send(tester_mq, "completed", true, 0, false, false, &err);
    HANDLE_ERR(err_sender);
    test_log("SENDER: sent COMPLETED");
    sleep(send_delay_in_seconds);

    test_log("SENDER: sending IGNORED...");
    tester_mq_send(tester_mq, "ignored", false, 0, true, false, &err);
    HANDLE_ERR(err_sender);
    test_log("SENDER: sent IGNORED");
    sleep(send_delay_in_seconds);

    test_log("SENDER: sending ACCEPTED...");
    tester_mq_send(tester_mq, "accepted", false, 0, false, true, &err);
    HANDLE_ERR(err_sender);
    test_log("SENDER: sent ACCEPTED");
    sleep(send_delay_in_seconds);

    test_log("SENDER: finishing...");
    tester_mq_finish(false, tester_mq, NULL, &err);
    HANDLE_ERR(err_sender);
    test_log("SENDER: finish");
}